

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O3

ssize_t __thiscall Socket::read(Socket *this,int __fd,void *__buf,size_t __nbytes)

{
  int __errnum;
  bool bVar1;
  ssize_t sVar2;
  int *piVar3;
  char *__s;
  size_t sVar4;
  runtime_error *this_00;
  void *__n;
  uint uVar5;
  undefined4 in_register_00000034;
  stringstream stream;
  string local_1c8;
  stringstream local_1a8 [16];
  long local_198 [3];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  bVar1 = Select(this,(timeval *)__nbytes);
  if (bVar1) {
    __n = (void *)0x7fffffff;
    if (__buf < (void *)0x7fffffff) {
      __n = __buf;
    }
    sVar2 = recv(this->m_Socket,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__n,0);
    uVar5 = (uint)sVar2;
    if (0 < (int)uVar5) {
      return (ulong)(uVar5 & 0x7fffffff);
    }
    piVar3 = __errno_location();
    if (((uVar5 == 0) || (__errnum = *piVar3, __errnum == 0x6b)) || (__errnum == 0x67)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"connection closed by remote");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"read frame failed with error: ",0x1e);
    *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 2;
    __s = strerror(__errnum);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar4);
    }
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  return 0;
}

Assistant:

size_t Socket::read(uint8_t* buffer, size_t maxBytes, timeval* timeout) const
{
    if (!Select(timeout)) {
        return 0;
    }

    const auto msvcMaxBytes = static_cast<int>(std::min<size_t>(std::numeric_limits<int>::max(), maxBytes));
    const int bytesRead = recv(m_Socket, reinterpret_cast<char*>(buffer), msvcMaxBytes, 0);
    if (bytesRead > 0) {
        return bytesRead;
    }
    const auto lastError = WSAGetLastError();
    if ((0 == bytesRead) || (lastError == CONNECTION_CLOSED) || (lastError == CONNECTION_ABORTED)) {
        throw std::runtime_error("connection closed by remote");
    } else {
        LOG_ERROR("read frame failed with error: " << std::dec << std::strerror(lastError));
    }
    return 0;
}